

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::InvalidateFboTargetCase::render(InvalidateFboTargetCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  deUint32 dVar1;
  uint *puVar2;
  deUint32 *pdVar3;
  deUint32 program;
  int iVar4;
  int iVar5;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var6;
  Context *pCVar7;
  deUint32 *attachments;
  ulong uVar8;
  uint target;
  deUint32 depthStencilRbo;
  deUint32 fbo;
  undefined4 local_218;
  undefined4 local_214;
  deUint32 colorRbo;
  undefined4 local_20c;
  Vector<float,_4> res;
  deUint32 dummyColorRbo;
  float fStack_1f4;
  float local_1f0;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  Surface *local_1d8;
  TextureFormat colorFmt;
  TextureFormatInfo colorFmtInfo;
  FlatColorShader flatShader;
  
  colorFmt = glu::mapGLInternalFormat(0x8058);
  tcu::getTextureFormatInfo(&colorFmtInfo,&colorFmt);
  local_1e8 = colorFmtInfo.valueMax.m_data[0] - colorFmtInfo.valueMin.m_data[0];
  fStack_1e4 = colorFmtInfo.valueMax.m_data[1] - colorFmtInfo.valueMin.m_data[1];
  fStack_1e0 = colorFmtInfo.valueMax.m_data[2] - colorFmtInfo.valueMin.m_data[2];
  fStack_1dc = colorFmtInfo.valueMax.m_data[3] - colorFmtInfo.valueMin.m_data[3];
  dVar1 = this->m_boundTarget;
  if (((dVar1 == 0x8d40) || (this->m_invalidateTarget == dVar1)) ||
     (dVar1 == 0x8ca9 && this->m_invalidateTarget == 0x8d40)) {
    flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader._0_4_ = 0x8ce0;
    _Var6 = std::
            __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                      ((this->m_invalidateAttachments).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (this->m_invalidateAttachments).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&flatShader);
    puVar2 = (this->m_invalidateAttachments).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_20c = (undefined4)
                CONCAT71((int7)((ulong)_Var6._M_current >> 8),_Var6._M_current != puVar2);
    flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader._0_4_ = 0x8d00;
    _Var6 = std::
            __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                      ((this->m_invalidateAttachments).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start,puVar2,&flatShader);
    if (_Var6._M_current ==
        (this->m_invalidateAttachments).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader._0_4_ = 0x821a;
      _Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                        ((this->m_invalidateAttachments).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start);
      local_214 = (undefined4)
                  CONCAT71((int7)((ulong)_Var6._M_current >> 8),
                           _Var6._M_current !=
                           (this->m_invalidateAttachments).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish);
    }
    else {
      local_214 = (undefined4)CONCAT71((int7)((ulong)_Var6._M_current >> 8),1);
    }
    flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader._0_4_ = 0x8d20;
    _Var6 = std::
            __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                      ((this->m_invalidateAttachments).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start);
    if (_Var6._M_current ==
        (this->m_invalidateAttachments).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader._0_4_ = 0x821a;
      _Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                        ((this->m_invalidateAttachments).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start);
      local_218 = (undefined4)
                  CONCAT71((int7)((ulong)_Var6._M_current >> 8),
                           _Var6._M_current !=
                           (this->m_invalidateAttachments).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish);
    }
    else {
      local_218 = (undefined4)CONCAT71((int7)((ulong)_Var6._M_current >> 8),1);
    }
  }
  else {
    local_214 = 0;
    local_20c = 0;
    local_218 = 0;
  }
  fbo = 0;
  colorRbo = 0;
  depthStencilRbo = 0;
  FboTestUtil::FlatColorShader::FlatColorShader(&flatShader,TYPE_FLOAT_VEC4);
  this_00 = &(this->super_FboTestCase).super_ContextWrapper;
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  program = (*pCVar7->_vptr_Context[0x75])(pCVar7,&flatShader);
  sglr::ContextWrapper::glGenRenderbuffers(this_00,1,&colorRbo);
  sglr::ContextWrapper::glBindRenderbuffer(this_00,0x8d41,colorRbo);
  iVar4 = sglr::ContextWrapper::getWidth(this_00);
  iVar5 = sglr::ContextWrapper::getHeight(this_00);
  sglr::ContextWrapper::glRenderbufferStorage(this_00,0x8d41,0x8058,iVar4,iVar5);
  sglr::ContextWrapper::glGenRenderbuffers(this_00,1,&depthStencilRbo);
  sglr::ContextWrapper::glBindRenderbuffer(this_00,0x8d41,depthStencilRbo);
  iVar4 = sglr::ContextWrapper::getWidth(this_00);
  iVar5 = sglr::ContextWrapper::getHeight(this_00);
  sglr::ContextWrapper::glRenderbufferStorage(this_00,0x8d41,0x88f0,iVar4,iVar5);
  sglr::ContextWrapper::glGenFramebuffers(this_00,1,&fbo);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,fbo);
  sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8ce0,0x8d41,colorRbo);
  sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8d00,0x8d41,depthStencilRbo);
  sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8d20,0x8d41,depthStencilRbo);
  FboTestCase::checkFramebufferStatus(&this->super_FboTestCase,0x8d40);
  sglr::ContextWrapper::glClearColor(this_00,0.0,0.0,0.0,1.0);
  sglr::ContextWrapper::glClear(this_00,0x4500);
  sglr::ContextWrapper::glEnable(this_00,0xb71);
  sglr::ContextWrapper::glEnable(this_00,0xb90);
  sglr::ContextWrapper::glStencilOp(this_00,0x1e00,0x1e00,0x1e01);
  sglr::ContextWrapper::glStencilFunc(this_00,0x207,1,0xff);
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  res.m_data[2] = fStack_1e0 * 0.0 + colorFmtInfo.valueMin.m_data[2];
  res.m_data[3] = fStack_1dc * 1.0 + colorFmtInfo.valueMin.m_data[3];
  res.m_data[1] = fStack_1e4 * 0.0 + colorFmtInfo.valueMin.m_data[1];
  res.m_data[0] = local_1e8 * 1.0 + colorFmtInfo.valueMin.m_data[0];
  FboTestUtil::FlatColorShader::setColor(&flatShader,pCVar7,program,&res);
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  res.m_data[0] = -1.0;
  res.m_data[1] = -1.0;
  res.m_data[2] = -1.0;
  _dummyColorRbo = 0x3f8000003f800000;
  local_1f0 = 1.0;
  sglr::drawQuad(pCVar7,program,(Vec3 *)&res,(Vec3 *)&dummyColorRbo);
  dVar1 = this->m_boundTarget;
  if (dVar1 != 0x8d40) {
    res.m_data._0_8_ = res.m_data._0_8_ & 0xffffffff00000000;
    _dummyColorRbo = _dummyColorRbo & 0xffffffff00000000;
    local_1d8 = dst;
    sglr::ContextWrapper::glGenRenderbuffers(this_00,1,&dummyColorRbo);
    sglr::ContextWrapper::glBindRenderbuffer(this_00,0x8d41,dummyColorRbo);
    sglr::ContextWrapper::glRenderbufferStorage(this_00,0x8d41,0x8058,0x40,0x40);
    sglr::ContextWrapper::glGenFramebuffers(this_00,1,(deUint32 *)&res);
    target = dVar1 == 0x8ca9 ^ 0x8ca9;
    sglr::ContextWrapper::glBindFramebuffer(this_00,target,(deUint32)res.m_data[0]);
    sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,target,0x8ce0,0x8d41,dummyColorRbo);
    sglr::ContextWrapper::glBindFramebuffer(this_00,this->m_boundTarget,fbo);
    dst = local_1d8;
  }
  pdVar3 = (this->m_invalidateAttachments).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = (long)(this->m_invalidateAttachments).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar3;
  attachments = (deUint32 *)0x0;
  if (uVar8 != 0) {
    attachments = pdVar3;
  }
  sglr::ContextWrapper::glInvalidateFramebuffer
            (this_00,this->m_invalidateTarget,(int)(uVar8 >> 2),attachments);
  if (this->m_boundTarget != 0x8d40) {
    sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,fbo);
  }
  if ((char)local_20c != '\0') {
    sglr::ContextWrapper::glDisable(this_00,0xb71);
    sglr::ContextWrapper::glDisable(this_00,0xb90);
    pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
    res.m_data[2] = fStack_1e0 * 0.0 + colorFmtInfo.valueMin.m_data[2];
    res.m_data[3] = fStack_1dc * 1.0 + colorFmtInfo.valueMin.m_data[3];
    res.m_data[1] = fStack_1e4 * 1.0 + colorFmtInfo.valueMin.m_data[1];
    res.m_data[0] = local_1e8 * 0.0 + colorFmtInfo.valueMin.m_data[0];
    FboTestUtil::FlatColorShader::setColor(&flatShader,pCVar7,program,&res);
    pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
    res.m_data[0] = -1.0;
    res.m_data[1] = -1.0;
    res.m_data[2] = 0.0;
    _dummyColorRbo = 0x3f8000003f800000;
    local_1f0 = 0.0;
    sglr::drawQuad(pCVar7,program,(Vec3 *)&res,(Vec3 *)&dummyColorRbo);
    sglr::ContextWrapper::glEnable(this_00,0xb71);
    sglr::ContextWrapper::glEnable(this_00,0xb90);
  }
  if ((char)local_214 != '\0') {
    sglr::ContextWrapper::glDepthFunc(this_00,0x207);
  }
  if ((char)local_218 == '\0') {
    sglr::ContextWrapper::glStencilFunc(this_00,0x202,1,0xff);
  }
  sglr::ContextWrapper::glEnable(this_00,0xbe2);
  sglr::ContextWrapper::glBlendFunc(this_00,1,1);
  sglr::ContextWrapper::glBlendEquation(this_00,0x8006);
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  res.m_data[2] = fStack_1e0 * 1.0 + colorFmtInfo.valueMin.m_data[2];
  res.m_data[3] = fStack_1dc * 1.0 + colorFmtInfo.valueMin.m_data[3];
  res.m_data[1] = fStack_1e4 * 0.0 + colorFmtInfo.valueMin.m_data[1];
  res.m_data[0] = local_1e8 * 0.0 + colorFmtInfo.valueMin.m_data[0];
  FboTestUtil::FlatColorShader::setColor(&flatShader,pCVar7,program,&res);
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  res.m_data[0] = -1.0;
  res.m_data[1] = -1.0;
  res.m_data[2] = 0.0;
  dummyColorRbo = 0x3f800000;
  fStack_1f4 = 1.0;
  local_1f0 = 0.0;
  sglr::drawQuad(pCVar7,program,(Vec3 *)&res,(Vec3 *)&dummyColorRbo);
  iVar4 = sglr::ContextWrapper::getWidth(this_00);
  iVar5 = sglr::ContextWrapper::getHeight(this_00);
  FboTestCase::readPixels
            (&this->super_FboTestCase,dst,0,0,iVar4,iVar5,&colorFmt,&colorFmtInfo.lookupScale,
             &colorFmtInfo.lookupBias);
  sglr::ShaderProgram::~ShaderProgram(&flatShader.super_ShaderProgram);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		const deUint32					colorFormat				= GL_RGBA8;
		const deUint32					depthStencilFormat		= GL_DEPTH24_STENCIL8;
		const tcu::TextureFormat		colorFmt				= glu::mapGLInternalFormat(colorFormat);
		const tcu::TextureFormatInfo	colorFmtInfo			= tcu::getTextureFormatInfo(colorFmt);
		const tcu::Vec4&				cBias					= colorFmtInfo.valueMin;
		const tcu::Vec4					cScale					= colorFmtInfo.valueMax-colorFmtInfo.valueMin;
		const bool						isDiscarded				= (m_boundTarget == GL_FRAMEBUFFER) ||
																  (m_invalidateTarget == GL_FRAMEBUFFER && m_boundTarget == GL_DRAW_FRAMEBUFFER) ||
																  (m_invalidateTarget == m_boundTarget);
		const bool						isColorDiscarded		= isDiscarded && hasAttachment(m_invalidateAttachments, GL_COLOR_ATTACHMENT0);
		const bool						isDepthDiscarded		= isDiscarded && (hasAttachment(m_invalidateAttachments, GL_DEPTH_ATTACHMENT) || hasAttachment(m_invalidateAttachments, GL_DEPTH_STENCIL_ATTACHMENT));
		const bool						isStencilDiscarded		= isDiscarded && (hasAttachment(m_invalidateAttachments, GL_STENCIL_ATTACHMENT) || hasAttachment(m_invalidateAttachments, GL_DEPTH_STENCIL_ATTACHMENT));

		deUint32						fbo						= 0;
		deUint32						colorRbo				= 0;
		deUint32						depthStencilRbo			= 0;
		FlatColorShader					flatShader				(glu::TYPE_FLOAT_VEC4);
		deUint32						flatShaderID			= getCurrentContext()->createProgram(&flatShader);

		// Create fbo.
		glGenRenderbuffers		(1, &colorRbo);
		glBindRenderbuffer		(GL_RENDERBUFFER, colorRbo);
		glRenderbufferStorage	(GL_RENDERBUFFER, colorFormat, getWidth(), getHeight());

		glGenRenderbuffers		(1, &depthStencilRbo);
		glBindRenderbuffer		(GL_RENDERBUFFER, depthStencilRbo);
		glRenderbufferStorage	(GL_RENDERBUFFER, depthStencilFormat, getWidth(), getHeight());

		glGenFramebuffers			(1, &fbo);
		glBindFramebuffer			(GL_FRAMEBUFFER, fbo);
		glFramebufferRenderbuffer	(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, colorRbo);
		glFramebufferRenderbuffer	(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, depthStencilRbo);
		glFramebufferRenderbuffer	(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, depthStencilRbo);

		checkFramebufferStatus		(GL_FRAMEBUFFER);

		glClearColor	(0.0f, 0.0f, 0.0f, 1.0f);
		glClear			(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		glEnable		(GL_DEPTH_TEST);
		glEnable		(GL_STENCIL_TEST);
		glStencilOp		(GL_KEEP, GL_KEEP, GL_REPLACE);
		glStencilFunc	(GL_ALWAYS, 1, 0xff);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(1.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias);
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

		// Bound FBO to test target and default to other
		if (m_boundTarget != GL_FRAMEBUFFER)
		{
			// Dummy fbo is used as complemeting target (read when discarding draw for example).
			// \note Framework takes care of deleting objects at the end of test case.
			const deUint32	dummyTarget		= m_boundTarget == GL_DRAW_FRAMEBUFFER ?  GL_READ_FRAMEBUFFER : GL_DRAW_FRAMEBUFFER;
			deUint32		dummyFbo		= 0;
			deUint32		dummyColorRbo	= 0;

			glGenRenderbuffers			(1, &dummyColorRbo);
			glBindRenderbuffer			(GL_RENDERBUFFER, dummyColorRbo);
			glRenderbufferStorage		(GL_RENDERBUFFER, GL_RGBA8, 64, 64);
			glGenFramebuffers			(1, &dummyFbo);
			glBindFramebuffer			(dummyTarget, dummyFbo);
			glFramebufferRenderbuffer	(dummyTarget, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, dummyColorRbo);

			glBindFramebuffer			(m_boundTarget, fbo);
		}

		glInvalidateFramebuffer(m_invalidateTarget, (int)m_invalidateAttachments.size(), m_invalidateAttachments.empty() ? DE_NULL : &m_invalidateAttachments[0]);

		if (m_boundTarget != GL_FRAMEBUFFER)
			glBindFramebuffer(GL_FRAMEBUFFER, fbo);

		if (isColorDiscarded)
		{
			// Color was not preserved - fill with green.
			glDisable(GL_DEPTH_TEST);
			glDisable(GL_STENCIL_TEST);

			flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 1.0f, 0.0f, 1.0f)*cScale + cBias);
			sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

			glEnable(GL_DEPTH_TEST);
			glEnable(GL_STENCIL_TEST);
		}

		if (isDepthDiscarded)
		{
			// Depth was not preserved.
			glDepthFunc(GL_ALWAYS);
		}

		if (!isStencilDiscarded)
		{
			// Stencil was preserved.
			glStencilFunc(GL_EQUAL, 1, 0xff);
		}

		glEnable		(GL_BLEND);
		glBlendFunc		(GL_ONE, GL_ONE);
		glBlendEquation	(GL_FUNC_ADD);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 0.0f, 1.0f, 1.0f)*cScale + cBias);
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		readPixels(dst, 0, 0, getWidth(), getHeight(), colorFmt, colorFmtInfo.lookupScale, colorFmtInfo.lookupBias);
	}